

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

void matd_utriangle_solve(matd_t *u,double *b,double *x)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int j;
  ulong uVar6;
  double dVar7;
  
  uVar2 = u->ncols;
  uVar4 = uVar2 * uVar2;
  uVar6 = (ulong)uVar2;
  while( true ) {
    uVar1 = uVar6 - 1;
    uVar5 = (uint)uVar1;
    if ((int)uVar5 < 0) break;
    dVar7 = b[uVar5 & 0x7fffffff];
    uVar3 = uVar4;
    for (; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      dVar7 = dVar7 - (double)u[(ulong)uVar3 + 1] * x[uVar6];
      uVar3 = uVar3 + 1;
    }
    x[uVar5 & 0x7fffffff] = dVar7 / (double)u[(ulong)((uVar2 + 1) * uVar5) + 1];
    uVar4 = uVar4 + ~uVar2;
    uVar6 = uVar1;
  }
  return;
}

Assistant:

void matd_utriangle_solve(matd_t *u, const TYPE *b, TYPE *x)
{
    for (int i = u->ncols-1; i >= 0; i--) {
        double bi = b[i];

        double diag = MATD_EL(u, i, i);

        for (int j = i+1; j < u->ncols; j++)
            bi -= MATD_EL(u, i, j)*x[j];

        x[i] = bi / diag;
    }
}